

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandVarMin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint fVerbose;
  uint fCheck;
  char *pcVar5;
  uint fUseSimple;
  uint local_38;
  uint local_34;
  
  fUseSimple = 0;
  Extra_UtilGetoptReset();
  local_34 = 0x14;
  local_38 = 4;
  fCheck = 0;
  fVerbose = 0;
LAB_0021f94a:
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"MNocvh"), iVar1 = globalUtilOptind, iVar2 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 == -1) {
        if (globalUtilOptind + 1 == argc) {
          Abc_SuppReadMinTest(argv[globalUtilOptind]);
        }
        else {
          Abc_SuppTest(local_38,local_34,fUseSimple,fCheck,fVerbose);
        }
        return 0;
      }
      if (iVar2 != 0x6f) break;
      fUseSimple = fUseSimple ^ 1;
    }
    if (iVar2 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_0021fa5c:
        Abc_Print(-1,pcVar4);
        goto LAB_0021fa66;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_34 = uVar3;
    }
    else {
      if (iVar2 == 99) {
        fCheck = fCheck ^ 1;
        goto LAB_0021f94a;
      }
      if (iVar2 != 0x4d) goto LAB_0021fa66;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
        goto LAB_0021fa5c;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_38 = uVar3;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_0021fa66:
      Abc_Print(-2,"usage: varmin [-MN <num>] [-ocvh]\n");
      Abc_Print(-2,"\t           performs support minimization\n");
      Abc_Print(-2,"\t-M <num> : the number of ones in the combination [default = %d]\n",
                (ulong)local_38);
      Abc_Print(-2,"\t-N <num> : the number of variables in the problem [default = %d]\n",
                (ulong)local_34);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fUseSimple == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-o       : toggle computing reduced difference matrix [default = %s]\n",pcVar4
               );
      pcVar4 = "yes";
      if (fCheck == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c       : toggle verifying the final result [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandVarMin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_SuppTest( int nOnes, int nVars, int fUseSimple, int fCheck, int fVerbose );
    extern void Abc_SuppReadMinTest( char * pFileName );
    int nOnes      =  4;
    int nVars      = 20;
    int fUseSimple =  0;
    int fCheck     =  0;
    int fVerbose   =  0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MNocvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nOnes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOnes < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'o':
            fUseSimple ^= 1;
            break;
        case 'c':
            fCheck ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        Abc_SuppReadMinTest( argv[globalUtilOptind] );
        return 0;
    }
    Abc_SuppTest( nOnes, nVars, fUseSimple, fCheck, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: varmin [-MN <num>] [-ocvh]\n" );
    Abc_Print( -2, "\t           performs support minimization\n" );
    Abc_Print( -2, "\t-M <num> : the number of ones in the combination [default = %d]\n", nOnes );
    Abc_Print( -2, "\t-N <num> : the number of variables in the problem [default = %d]\n", nVars );
    Abc_Print( -2, "\t-o       : toggle computing reduced difference matrix [default = %s]\n", fUseSimple? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle verifying the final result [default = %s]\n", fCheck? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}